

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jnt_convolve_avx2.c
# Opt level: O0

void av1_dist_wtd_convolve_x_avx2
               (uint8_t *src,int src_stride,uint8_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params)

{
  undefined8 *puVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  __m256i data_00;
  __m256i data_01;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  char cVar14;
  undefined1 auVar22 [16];
  uint uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  uint8_t *puVar19;
  uint in_ECX;
  uint uVar20;
  long in_RDX;
  void *extraout_RDX;
  void *pvVar21;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar23 [32];
  undefined8 uVar27;
  undefined1 auVar24 [32];
  undefined8 uVar26;
  undefined1 auVar25 [64];
  long in_stack_00000008;
  undefined4 in_stack_0000001c;
  __m128i res_0_3;
  __m128i res_1_2;
  __m128i res_0_2;
  __m256i res_8_1;
  __m256i round_result_1;
  __m256i comp_avg_res_1;
  __m256i data_ref_0_1;
  __m256i res_unsigned_1;
  __m256i res_2;
  __m256i data_1;
  CONV_BUF_TYPE *dst_data_1;
  uint8_t *src_data_1;
  uint8_t *src_ptr_1;
  int fo_horiz_1;
  __m128i res_1_1;
  __m128i res_0_1;
  __m128i res_1;
  __m128i res_0;
  __m256i res_8;
  __m256i round_result;
  __m256i comp_avg_res;
  __m256i data_ref_0;
  __m256i res_unsigned;
  __m256i res;
  __m256i data;
  CONV_BUF_TYPE *dst_data;
  uint8_t *src_data;
  uint8_t *src_ptr;
  int fo_horiz;
  __m256i coeffs [4];
  __m256i filt [4];
  __m128i round_shift;
  __m256i round_const;
  __m256i rounding_const;
  int rounding_shift;
  __m256i offset_const;
  int offset;
  int offset_0;
  int use_dist_wtd_comp_avg;
  int do_average;
  __m256i wt;
  int bits;
  int is_horiz_4tap;
  int j;
  int i;
  int bd;
  int dst_stride;
  CONV_BUF_TYPE *dst;
  undefined8 in_stack_fffffffffffff558;
  __m256i *in_stack_fffffffffffff560;
  __m256i *in_stack_fffffffffffff568;
  __m256i *in_stack_fffffffffffff570;
  undefined4 in_stack_fffffffffffff578;
  int in_stack_fffffffffffff57c;
  InterpFilterParams *in_stack_fffffffffffff580;
  ConvolveParams *in_stack_fffffffffffff588;
  longlong in_stack_fffffffffffff590;
  __m256i *palStack_a68;
  __m256i *in_stack_fffffffffffff5a8;
  __m256i *in_stack_fffffffffffff5b0;
  longlong in_stack_fffffffffffff5b8;
  undefined1 in_stack_fffffffffffff5c0 [24];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  __m256i *palStack_9f0;
  int use_dist_wtd_comp_avg_00;
  undefined1 in_stack_fffffffffffff620 [32];
  undefined8 local_940;
  undefined8 uStack_930;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined1 local_8a0 [16];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  byte local_6c4;
  ushort local_690;
  byte local_68c;
  uint local_648;
  int local_644;
  ulong local_600;
  uint local_200;
  undefined4 local_1e0;
  uint local_1c0;
  undefined4 local_1a0;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  lVar4 = *(long *)(CONCAT44(in_stack_0000001c,subpel_x_qn) + 8);
  uVar2 = *(uint *)(CONCAT44(in_stack_0000001c,subpel_x_qn) + 0x10);
  uVar15 = 7 - *(int *)(CONCAT44(in_stack_0000001c,subpel_x_qn) + 0x18);
  unpack_weights_avx2(in_stack_fffffffffffff588);
  iVar3 = *(int *)CONCAT44(in_stack_0000001c,subpel_x_qn);
  cVar14 = -((char)*(undefined4 *)(CONCAT44(in_stack_0000001c,subpel_x_qn) + 0x14) +
            (char)*(undefined4 *)(CONCAT44(in_stack_0000001c,subpel_x_qn) + 0x18));
  local_68c = cVar14 + 0x16;
  uVar20 = (1 << (local_68c & 0x1f)) + (1 << (cVar14 + 0x15U & 0x1f));
  local_690 = (ushort)uVar20;
  auVar5 = vpinsrw_avx(ZEXT216(local_690),uVar20 & 0xffff,1);
  auVar5 = vpinsrw_avx(auVar5,uVar20 & 0xffff,2);
  auVar5 = vpinsrw_avx(auVar5,uVar20 & 0xffff,3);
  auVar5 = vpinsrw_avx(auVar5,uVar20 & 0xffff,4);
  auVar5 = vpinsrw_avx(auVar5,uVar20 & 0xffff,5);
  auVar5 = vpinsrw_avx(auVar5,uVar20 & 0xffff,6);
  auVar5 = vpinsrw_avx(auVar5,uVar20 & 0xffff,7);
  auVar6 = vpinsrw_avx(ZEXT216(local_690),uVar20 & 0xffff,1);
  auVar6 = vpinsrw_avx(auVar6,uVar20 & 0xffff,2);
  auVar6 = vpinsrw_avx(auVar6,uVar20 & 0xffff,3);
  auVar6 = vpinsrw_avx(auVar6,uVar20 & 0xffff,4);
  auVar6 = vpinsrw_avx(auVar6,uVar20 & 0xffff,5);
  auVar6 = vpinsrw_avx(auVar6,uVar20 & 0xffff,6);
  auVar6 = vpinsrw_avx(auVar6,uVar20 & 0xffff,7);
  uStack_f0 = auVar6._0_8_;
  uStack_e8 = auVar6._8_8_;
  local_6c4 = 0xe - ((char)*(undefined4 *)(CONCAT44(in_stack_0000001c,subpel_x_qn) + 0x14) +
                    (char)*(undefined4 *)(CONCAT44(in_stack_0000001c,subpel_x_qn) + 0x18));
  uVar20 = (uint)(1 << (local_6c4 & 0x1f)) >> 1;
  auVar6 = vpinsrw_avx(ZEXT216((ushort)uVar20),uVar20 & 0xffff,1);
  auVar6 = vpinsrw_avx(auVar6,uVar20 & 0xffff,2);
  auVar6 = vpinsrw_avx(auVar6,uVar20 & 0xffff,3);
  auVar6 = vpinsrw_avx(auVar6,uVar20 & 0xffff,4);
  auVar6 = vpinsrw_avx(auVar6,uVar20 & 0xffff,5);
  auVar6 = vpinsrw_avx(auVar6,uVar20 & 0xffff,6);
  vpinsrw_avx(auVar6,uVar20 & 0xffff,7);
  auVar6 = vpinsrw_avx(ZEXT216((ushort)uVar20),uVar20 & 0xffff,1);
  auVar6 = vpinsrw_avx(auVar6,uVar20 & 0xffff,2);
  auVar6 = vpinsrw_avx(auVar6,uVar20 & 0xffff,3);
  auVar6 = vpinsrw_avx(auVar6,uVar20 & 0xffff,4);
  auVar6 = vpinsrw_avx(auVar6,uVar20 & 0xffff,5);
  auVar6 = vpinsrw_avx(auVar6,uVar20 & 0xffff,6);
  vpinsrw_avx(auVar6,uVar20 & 0xffff,7);
  uVar20 = (uint)(1 << (*(char *)(CONCAT44(in_stack_0000001c,subpel_x_qn) + 0x14) - 1U & 0x1f)) >> 1
  ;
  auVar6 = vpinsrw_avx(ZEXT216((ushort)uVar20),uVar20 & 0xffff,1);
  auVar6 = vpinsrw_avx(auVar6,uVar20 & 0xffff,2);
  auVar6 = vpinsrw_avx(auVar6,uVar20 & 0xffff,3);
  auVar6 = vpinsrw_avx(auVar6,uVar20 & 0xffff,4);
  auVar6 = vpinsrw_avx(auVar6,uVar20 & 0xffff,5);
  auVar6 = vpinsrw_avx(auVar6,uVar20 & 0xffff,6);
  auVar6 = vpinsrw_avx(auVar6,uVar20 & 0xffff,7);
  auVar22 = vpinsrw_avx(ZEXT216((ushort)uVar20),uVar20 & 0xffff,1);
  auVar22 = vpinsrw_avx(auVar22,uVar20 & 0xffff,2);
  auVar22 = vpinsrw_avx(auVar22,uVar20 & 0xffff,3);
  auVar22 = vpinsrw_avx(auVar22,uVar20 & 0xffff,4);
  auVar22 = vpinsrw_avx(auVar22,uVar20 & 0xffff,5);
  auVar22 = vpinsrw_avx(auVar22,uVar20 & 0xffff,6);
  auVar22 = vpinsrw_avx(auVar22,uVar20 & 0xffff,7);
  uStack_70 = auVar22._0_8_;
  uStack_68 = auVar22._8_8_;
  local_600 = CONCAT44(0,*(int *)(CONCAT44(in_stack_0000001c,subpel_x_qn) + 0x14) - 1);
  prepare_coeffs_lowbd
            (in_stack_fffffffffffff580,in_stack_fffffffffffff57c,in_stack_fffffffffffff570);
  auVar22._8_8_ = uStack_7d8;
  auVar22._0_8_ = local_7e0;
  auVar8._8_8_ = uStack_838;
  auVar8._0_8_ = local_840;
  auVar22 = vpor_avx(auVar8,auVar22);
  auVar25 = ZEXT1664(auVar22);
  if (auVar22._0_4_ == 0) {
    pvVar21 = extraout_RDX;
    for (local_644 = 0; local_644 < in_R9D; local_644 = local_644 + 2) {
      lVar16 = in_RDI + -1 + (long)(local_644 * in_ESI);
      lVar17 = lVar4 + (long)(int)(local_644 * uVar2) * 2;
      for (local_648 = 0; auVar23 = auVar25._0_32_, (int)local_648 < in_R8D;
          local_648 = local_648 + 8) {
        load_line2_avx2((__m256i *)(lVar16 + (int)local_648),
                        (void *)(lVar16 + (int)(local_648 + in_ESI)),pvVar21);
        local_880 = auVar23._0_8_;
        uStack_878 = auVar23._8_8_;
        uStack_870 = auVar23._16_8_;
        uStack_868 = auVar23._24_8_;
        data_00[0]._4_4_ = in_stack_fffffffffffff57c;
        data_00[0]._0_4_ = in_stack_fffffffffffff578;
        data_00[1] = (longlong)in_stack_fffffffffffff580;
        data_00[2] = (longlong)in_stack_fffffffffffff588;
        data_00[3] = in_stack_fffffffffffff590;
        convolve_lowbd_x_4tap(data_00,in_stack_fffffffffffff570,in_stack_fffffffffffff568);
        local_8a0._8_8_ = uStack_878;
        local_8a0._0_8_ = local_880;
        auVar24._16_8_ = uStack_870;
        auVar24._0_16_ = local_8a0;
        auVar24._24_8_ = uStack_868;
        auVar23._16_8_ = uStack_70;
        auVar23._0_16_ = auVar6;
        auVar23._24_8_ = uStack_68;
        auVar23 = vpaddw_avx2(auVar24,auVar23);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = local_600;
        auVar23 = vpsraw_avx2(auVar23,auVar10);
        auVar23 = vpsllw_avx2(auVar23,ZEXT416(uVar15));
        auVar7._16_8_ = uStack_f0;
        auVar7._0_16_ = auVar5;
        auVar7._24_8_ = uStack_e8;
        auVar23 = vpaddw_avx2(auVar23,auVar7);
        if (iVar3 == 0) {
          local_8c0 = auVar23._0_8_;
          uStack_8b8 = auVar23._8_8_;
          puVar1 = (undefined8 *)(lVar4 + (long)(int)(local_644 * uVar2 + local_648) * 2);
          *puVar1 = local_8c0;
          puVar1[1] = uStack_8b8;
          auVar22 = auVar23._16_16_;
          *(undefined1 (*) [16])(lVar4 + (long)(int)(local_644 * uVar2 + local_648 + uVar2) * 2) =
               auVar22;
          local_1c0 = local_648;
        }
        else {
          load_line2_avx2((__m256i *)(lVar17 + (long)(int)local_648 * 2),
                          (void *)(lVar17 + (long)(int)(local_648 + uVar2) * 2),(void *)(ulong)uVar2
                         );
          comp_avg(in_stack_fffffffffffff620._16_8_,in_stack_fffffffffffff620._8_8_,
                   in_stack_fffffffffffff620._0_8_,use_dist_wtd_comp_avg_00);
          convolve_rounding(in_stack_fffffffffffff570,in_stack_fffffffffffff568,
                            in_stack_fffffffffffff560,
                            (int)((ulong)in_stack_fffffffffffff558 >> 0x20));
          auVar23 = vpackuswb_avx2(auVar23,auVar23);
          local_940 = auVar23._0_8_;
          uStack_930 = auVar23._16_8_;
          if (in_R8D < 5) {
            local_1a0 = auVar23._0_4_;
            *(undefined4 *)(in_RDX + (int)(local_644 * in_ECX + local_648)) = local_1a0;
            local_1c0 = auVar23._16_4_;
            *(uint *)(in_RDX + (int)(local_644 * in_ECX + local_648 + in_ECX)) = local_1c0;
          }
          else {
            *(undefined8 *)(in_RDX + (int)(local_644 * in_ECX + local_648)) = local_940;
            *(undefined8 *)(in_RDX + (int)(local_644 * in_ECX + local_648 + in_ECX)) = uStack_930;
            local_1c0 = in_ECX;
          }
          auVar22 = auVar23._16_16_;
        }
        pvVar21 = (void *)(ulong)local_1c0;
        auVar25 = ZEXT1664(auVar22);
      }
    }
  }
  else {
    pvVar21 = (void *)(long)(int)(*(ushort *)(in_stack_00000008 + 8) / 2 - 1);
    lVar16 = in_RDI - (long)pvVar21;
    palStack_9f0 = (__m256i *)0xa09090808070706;
    palStack_a68 = (__m256i *)0xe0d0d0c0c0b0b0a;
    uVar26._0_1_ = '\x06';
    uVar26._1_1_ = '\a';
    uVar26._2_1_ = '\a';
    uVar26._3_1_ = '\b';
    uVar26._4_1_ = '\b';
    uVar26._5_1_ = '\t';
    uVar26._6_1_ = '\t';
    uVar26._7_1_ = '\n';
    uVar27._0_1_ = '\n';
    uVar27._1_1_ = '\v';
    uVar27._2_1_ = '\v';
    uVar27._3_1_ = '\f';
    uVar27._4_1_ = '\f';
    uVar27._5_1_ = '\r';
    uVar27._6_1_ = '\r';
    uVar27._7_1_ = '\x0e';
    uStack_9f8 = in_stack_fffffffffffff558;
    for (local_644 = 0; local_644 < in_R9D; local_644 = local_644 + 2) {
      lVar17 = lVar16 + local_644 * in_ESI;
      lVar18 = lVar4 + (long)(int)(local_644 * uVar2) * 2;
      for (local_648 = 0; (int)local_648 < in_R8D; local_648 = local_648 + 8) {
        load_line2_avx2((__m256i *)(lVar17 + (int)local_648),
                        (void *)(lVar17 + (int)(local_648 + in_ESI)),pvVar21);
        data_01[1] = in_stack_fffffffffffff5c0._0_8_;
        data_01[2] = in_stack_fffffffffffff5c0._8_8_;
        data_01[3] = in_stack_fffffffffffff5c0._16_8_;
        data_01[0] = in_stack_fffffffffffff5b8;
        convolve_lowbd_x(data_01,in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
        auVar13._8_8_ = palStack_a68;
        auVar13._0_8_ = palStack_9f0;
        auVar13[0x10] = (uint8_t)uVar26;
        auVar13[0x11] = SUB81(uVar26,1);
        auVar13[0x12] = SUB81(uVar26,2);
        auVar13[0x13] = SUB81(uVar26,3);
        auVar13[0x14] = SUB81(uVar26,4);
        auVar13[0x15] = SUB81(uVar26,5);
        auVar13[0x16] = SUB81(uVar26,6);
        auVar13[0x17] = SUB81(uVar26,7);
        auVar13[0x18] = (uint8_t)uVar27;
        auVar13[0x19] = SUB81(uVar27,1);
        auVar13[0x1a] = SUB81(uVar27,2);
        auVar13[0x1b] = SUB81(uVar27,3);
        auVar13[0x1c] = SUB81(uVar27,4);
        auVar13[0x1d] = SUB81(uVar27,5);
        auVar13[0x1e] = SUB81(uVar27,6);
        auVar13[0x1f] = SUB81(uVar27,7);
        auVar12._16_8_ = uStack_70;
        auVar12._0_16_ = auVar6;
        auVar12._24_8_ = uStack_68;
        auVar23 = vpaddw_avx2(auVar13,auVar12);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = local_600;
        auVar23 = vpsraw_avx2(auVar23,auVar9);
        auVar7 = vpsllw_avx2(auVar23,ZEXT416(uVar15));
        auVar11._16_8_ = uStack_f0;
        auVar11._0_16_ = auVar5;
        auVar11._24_8_ = uStack_e8;
        auVar23 = vpaddw_avx2(auVar7,auVar11);
        if (iVar3 == 0) {
          local_a00 = auVar23._0_8_;
          uStack_9f8 = auVar23._8_8_;
          palStack_9f0 = auVar23._16_8_;
          palStack_a68 = auVar23._24_8_;
          puVar1 = (undefined8 *)(lVar4 + (long)(int)(local_644 * uVar2 + local_648) * 2);
          *puVar1 = local_a00;
          puVar1[1] = uStack_9f8;
          puVar19 = (uint8_t *)(lVar4 + (long)(int)(local_644 * uVar2 + local_648 + uVar2) * 2);
          *(__m256i **)puVar19 = palStack_9f0;
          *(__m256i **)(puVar19 + 8) = palStack_a68;
          local_200 = local_648;
        }
        else {
          auVar24 = auVar23;
          load_line2_avx2((__m256i *)(lVar18 + (long)(int)local_648 * 2),
                          (void *)(lVar18 + (long)(int)(local_648 + uVar2) * 2),(void *)(ulong)uVar2
                         );
          use_dist_wtd_comp_avg_00 = auVar23._28_4_;
          comp_avg(auVar7._16_8_,auVar7._8_8_,auVar7._0_8_,use_dist_wtd_comp_avg_00);
          in_stack_fffffffffffff5c0 = auVar24._0_24_;
          convolve_rounding(in_stack_fffffffffffff570,in_stack_fffffffffffff568,
                            in_stack_fffffffffffff560,(int)((ulong)uStack_9f8 >> 0x20));
          in_stack_fffffffffffff5a8 = auVar24._8_8_;
          in_stack_fffffffffffff5b0 = auVar24._16_8_;
          in_stack_fffffffffffff5b8 = auVar24._24_8_;
          auVar23 = vpackuswb_avx2(auVar24,auVar24);
          in_stack_fffffffffffff570 = auVar23._0_8_;
          palStack_9f0 = auVar23._16_8_;
          palStack_a68 = auVar23._24_8_;
          in_stack_fffffffffffff560 = palStack_9f0;
          in_stack_fffffffffffff568 = palStack_a68;
          if (in_R8D < 5) {
            local_1e0 = auVar23._0_4_;
            *(undefined4 *)(in_RDX + (int)(local_644 * in_ECX + local_648)) = local_1e0;
            local_200 = auVar23._16_4_;
            *(uint *)(in_RDX + (int)(local_644 * in_ECX + local_648 + in_ECX)) = local_200;
          }
          else {
            *(__m256i **)(in_RDX + (int)(local_644 * in_ECX + local_648)) =
                 in_stack_fffffffffffff570;
            *(__m256i **)(in_RDX + (int)(local_644 * in_ECX + local_648 + in_ECX)) = palStack_9f0;
            local_200 = in_ECX;
          }
        }
        pvVar21 = (void *)(ulong)local_200;
        uVar26._0_1_ = '\0';
        uVar26._1_1_ = '\0';
        uVar26._2_1_ = '\0';
        uVar26._3_1_ = '\0';
        uVar26._4_1_ = '\0';
        uVar26._5_1_ = '\0';
        uVar26._6_1_ = '\0';
        uVar26._7_1_ = '\0';
        uVar27._0_1_ = '\0';
        uVar27._1_1_ = '\0';
        uVar27._2_1_ = '\0';
        uVar27._3_1_ = '\0';
        uVar27._4_1_ = '\0';
        uVar27._5_1_ = '\0';
        uVar27._6_1_ = '\0';
        uVar27._7_1_ = '\0';
      }
    }
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_x_avx2(const uint8_t *src, int src_stride,
                                  uint8_t *dst0, int dst_stride0, int w, int h,
                                  const InterpFilterParams *filter_params_x,
                                  const int subpel_x_qn,
                                  ConvolveParams *conv_params) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  const int bd = 8;
  int i, j, is_horiz_4tap = 0;
  const int bits = FILTER_BITS - conv_params->round_1;
  const __m256i wt = unpack_weights_avx2(conv_params);
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m256i offset_const = _mm256_set1_epi16(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m256i rounding_const = _mm256_set1_epi16((1 << rounding_shift) >> 1);

  assert(bits >= 0);
  assert(conv_params->round_0 > 0);

  const __m256i round_const =
      _mm256_set1_epi16((1 << (conv_params->round_0 - 1)) >> 1);
  const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_0 - 1);

  __m256i filt[4], coeffs[4];

  filt[0] = _mm256_load_si256((__m256i const *)filt_global_avx2);
  filt[1] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32));

  prepare_coeffs_lowbd(filter_params_x, subpel_x_qn, coeffs);

  // Condition for checking valid horz_filt taps
  if (!(_mm256_extract_epi32(_mm256_or_si256(coeffs[0], coeffs[3]), 0)))
    is_horiz_4tap = 1;

  // horz_filt as 4 tap
  if (is_horiz_4tap) {
    const int fo_horiz = 1;
    const uint8_t *const src_ptr = src - fo_horiz;
    for (i = 0; i < h; i += 2) {
      const uint8_t *src_data = src_ptr + i * src_stride;
      CONV_BUF_TYPE *dst_data = dst + i * dst_stride;
      for (j = 0; j < w; j += 8) {
        const __m256i data =
            load_line2_avx2(&src_data[j], &src_data[j + src_stride]);

        __m256i res = convolve_lowbd_x_4tap(data, coeffs + 1, filt);
        res = _mm256_sra_epi16(_mm256_add_epi16(res, round_const), round_shift);
        res = _mm256_slli_epi16(res, bits);

        const __m256i res_unsigned = _mm256_add_epi16(res, offset_const);

        // Accumulate values into the destination buffer
        if (do_average) {
          const __m256i data_ref_0 =
              load_line2_avx2(&dst_data[j], &dst_data[j + dst_stride]);
          const __m256i comp_avg_res =
              comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

          const __m256i round_result = convolve_rounding(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m256i res_8 = _mm256_packus_epi16(round_result, round_result);
          const __m128i res_0 = _mm256_castsi256_si128(res_8);
          const __m128i res_1 = _mm256_extracti128_si256(res_8, 1);

          if (w > 4) {
            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_storel_epi64(
                (__m128i *)((&dst0[i * dst_stride0 + j + dst_stride0])), res_1);
          } else {
            *(int *)(&dst0[i * dst_stride0 + j]) = _mm_cvtsi128_si32(res_0);
            *(int *)(&dst0[i * dst_stride0 + j + dst_stride0]) =
                _mm_cvtsi128_si32(res_1);
          }
        } else {
          const __m128i res_0 = _mm256_castsi256_si128(res_unsigned);
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);

          const __m128i res_1 = _mm256_extracti128_si256(res_unsigned, 1);
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                          res_1);
        }
      }
    }
  } else {
    const int fo_horiz = filter_params_x->taps / 2 - 1;
    const uint8_t *const src_ptr = src - fo_horiz;

    filt[2] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 2));
    filt[3] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 3));
    for (i = 0; i < h; i += 2) {
      const uint8_t *src_data = src_ptr + i * src_stride;
      CONV_BUF_TYPE *dst_data = dst + i * dst_stride;
      for (j = 0; j < w; j += 8) {
        const __m256i data =
            load_line2_avx2(&src_data[j], &src_data[j + src_stride]);

        __m256i res = convolve_lowbd_x(data, coeffs, filt);

        res = _mm256_sra_epi16(_mm256_add_epi16(res, round_const), round_shift);

        res = _mm256_slli_epi16(res, bits);

        const __m256i res_unsigned = _mm256_add_epi16(res, offset_const);

        // Accumulate values into the destination buffer
        if (do_average) {
          const __m256i data_ref_0 =
              load_line2_avx2(&dst_data[j], &dst_data[j + dst_stride]);
          const __m256i comp_avg_res =
              comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

          const __m256i round_result = convolve_rounding(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m256i res_8 = _mm256_packus_epi16(round_result, round_result);
          const __m128i res_0 = _mm256_castsi256_si128(res_8);
          const __m128i res_1 = _mm256_extracti128_si256(res_8, 1);

          if (w > 4) {
            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_storel_epi64(
                (__m128i *)((&dst0[i * dst_stride0 + j + dst_stride0])), res_1);
          } else {
            *(int *)(&dst0[i * dst_stride0 + j]) = _mm_cvtsi128_si32(res_0);
            *(int *)(&dst0[i * dst_stride0 + j + dst_stride0]) =
                _mm_cvtsi128_si32(res_1);
          }
        } else {
          const __m128i res_0 = _mm256_castsi256_si128(res_unsigned);
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);

          const __m128i res_1 = _mm256_extracti128_si256(res_unsigned, 1);
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                          res_1);
        }
      }
    }
  }
}